

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_send(ptls_t *tls,ptls_buffer_t *sendbuf,void *_input,size_t inlen)

{
  long lVar1;
  long lVar2;
  int iVar3;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  size_t sStack_40;
  int ret;
  size_t enc_size;
  size_t pt_size;
  uint8_t *input;
  size_t inlen_local;
  void *_input_local;
  ptls_buffer_t *sendbuf_local;
  ptls_t *tls_local;
  
  capacity._4_4_ = 0;
  pt_size = (size_t)_input;
  input = (uint8_t *)inlen;
  inlen_local = (size_t)_input;
  _input_local = sendbuf;
  sendbuf_local = (ptls_buffer_t *)tls;
  if ((tls->state < PTLS_STATE_SERVER_EXPECT_FINISHED) &&
     (tls->state != PTLS_STATE_CLIENT_SEND_EARLY_DATA)) {
    __assert_fail("tls->state >= PTLS_STATE_SERVER_EXPECT_FINISHED || tls->state == PTLS_STATE_CLIENT_SEND_EARLY_DATA"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/lib/picotls.c"
                  ,0x944,"int ptls_send(ptls_t *, ptls_buffer_t *, const void *, size_t)");
  }
  if ((char)(*(char *)&(tls->field_7).server << 7) < '\0') {
    *(byte *)&(tls->field_7).server = *(byte *)&(tls->field_7).server & 0xfe;
    capacity._4_4_ = send_session_ticket(tls,sendbuf);
    if (capacity._4_4_ != 0) {
      return capacity._4_4_;
    }
  }
  while( true ) {
    if (input == (uint8_t *)0x0) {
      return capacity._4_4_;
    }
    enc_size = (size_t)input;
    if ((uint8_t *)0x4000 < input) {
      enc_size = 0x4000;
    }
    capacity._1_1_ = 0x17;
    capacity._2_1_ = 3;
    capacity._3_1_ = 1;
    capacity._4_4_ =
         ptls_buffer__do_pushv((ptls_buffer_t *)_input_local,(void *)((long)&capacity + 1),3);
    if (capacity._4_4_ != 0) {
      return capacity._4_4_;
    }
    body_start = 2;
    capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)_input_local,"",2);
    if (capacity._4_4_ != 0) {
      return capacity._4_4_;
    }
    lVar1 = *(long *)((long)_input_local + 0x10);
    capacity._4_4_ = ptls_buffer_reserve((ptls_buffer_t *)_input_local,enc_size + 0x100);
    if (capacity._4_4_ != 0) break;
    iVar3 = ptls_aead_transform((ptls_aead_context_t *)sendbuf_local[7].base,
                                (void *)(*_input_local + *(long *)((long)_input_local + 0x10)),
                                &stack0xffffffffffffffc0,(void *)pt_size,enc_size,'\x17');
    if (iVar3 != 0) {
      return iVar3;
    }
    *(size_t *)((long)_input_local + 0x10) = sStack_40 + *(long *)((long)_input_local + 0x10);
    lVar2 = *(long *)((long)_input_local + 0x10);
    for (; body_start != 0; body_start = body_start - 1) {
      *(char *)(*_input_local + (lVar1 - body_start)) =
           (char)((ulong)(lVar2 - lVar1) >> (((char)body_start + -1) * '\b' & 0x3fU));
    }
    pt_size = enc_size + pt_size;
    input = input + -enc_size;
    capacity._4_4_ = 0;
  }
  return capacity._4_4_;
}

Assistant:

int ptls_send(ptls_t *tls, ptls_buffer_t *sendbuf, const void *_input, size_t inlen)
{
    const uint8_t *input = (const uint8_t *)_input;
    size_t pt_size, enc_size;
    int ret = 0;

    assert(tls->state >= PTLS_STATE_SERVER_EXPECT_FINISHED || tls->state == PTLS_STATE_CLIENT_SEND_EARLY_DATA);

    if (tls->server.send_ticket) {
        tls->server.send_ticket = 0;
        if ((ret = send_session_ticket(tls, sendbuf)) != 0)
            goto Exit;
    }

    for (; inlen != 0; input += pt_size, inlen -= pt_size) {
        pt_size = inlen;
        if (pt_size > PTLS_MAX_PLAINTEXT_RECORD_SIZE)
            pt_size = PTLS_MAX_PLAINTEXT_RECORD_SIZE;
        buffer_push_record(sendbuf, PTLS_CONTENT_TYPE_APPDATA, {
            if ((ret = ptls_buffer_reserve(sendbuf, pt_size + 256)) != 0)
                goto Exit;
            if ((ret = ptls_aead_transform(tls->traffic_protection.enc.aead, sendbuf->base + sendbuf->off, &enc_size, input,
                                           pt_size, PTLS_CONTENT_TYPE_APPDATA)) != 0)
                goto Exit;
            sendbuf->off += enc_size;
        });
    }

Exit:
    return ret;
}